

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall gutil::PropertyNode::PropertyNode(PropertyNode *this,string *_name)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::
  vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  ::vector((vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
            *)0x1a9a42);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    iVar1 = isdigit((int)*pcVar3);
    if (iVar1 != 0) {
      std::__cxx11::string::operator=(in_RDI,"x");
    }
  }
  std::__cxx11::string::append(in_RDI);
  return;
}

Assistant:

PropertyNode(const std::string &_name)
    {
      if (_name.size() > 0 && std::isdigit(_name[0]))
      {
        // name must not begin with a digit!
        name="x";
      }

      name.append(_name);
    }